

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<UncompressedRow>::reallocateAndGrow
          (QArrayDataPointer<UncompressedRow> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<UncompressedRow> *old)

{
  QArrayData *pQVar1;
  UncompressedRow *pUVar2;
  bool bVar3;
  const_iterator piVar4;
  const_iterator piVar5;
  int iVar6;
  undefined4 uVar7;
  UncompressedRow *pUVar8;
  qsizetype qVar9;
  long lVar10;
  UncompressedRow *pUVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  QArrayDataPointer<UncompressedRow> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<UncompressedRow> *)0x0 && where == GrowsAtEnd) {
    pQVar1 = &this->d->super_QArrayData;
    if (pQVar1 == (QArrayData *)0x0) {
      bVar3 = true;
    }
    else {
      bVar3 = 1 < (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar3)) {
      if (pQVar1 == (QArrayData *)0x0) {
        qVar9 = 0;
        lVar10 = 0;
      }
      else {
        qVar9 = pQVar1->alloc;
        lVar10 = (this->size - pQVar1->alloc) +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
                 -0x3333333333333333;
      }
      auVar12 = QArrayData::reallocateUnaligned(pQVar1,this->ptr,0x28,qVar9 + n + lVar10,Grow);
      this->d = (Data *)auVar12._0_8_;
      this->ptr = (UncompressedRow *)auVar12._8_8_;
      goto LAB_00104a79;
    }
  }
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (UncompressedRow *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if (this->size != 0) {
    lVar10 = this->size + (n >> 0x3f & n);
    if (this->d == (Data *)0x0) {
      bVar3 = true;
    }
    else {
      bVar3 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    pUVar8 = this->ptr;
    pUVar2 = pUVar8 + lVar10;
    if ((old != (QArrayDataPointer<UncompressedRow> *)0x0) || (bVar3)) {
      if ((lVar10 != 0) && (0 < lVar10)) {
        pUVar11 = local_38.ptr + local_38.size;
        do {
          pUVar11->_M_endNonZeros = pUVar8->_M_endNonZeros;
          iVar6 = pUVar8->_M_index;
          uVar7 = *(undefined4 *)&pUVar8->field_0x4;
          piVar4 = pUVar8->_M_begin;
          piVar5 = pUVar8->_M_beginNonZeros;
          pUVar11->_M_end = pUVar8->_M_end;
          pUVar11->_M_beginNonZeros = piVar5;
          pUVar11->_M_index = iVar6;
          *(undefined4 *)&pUVar11->field_0x4 = uVar7;
          pUVar11->_M_begin = piVar4;
          pUVar8 = pUVar8 + 1;
          local_38.size = local_38.size + 1;
          pUVar11 = pUVar11 + 1;
        } while (pUVar8 < pUVar2);
      }
    }
    else if ((lVar10 != 0) && (0 < lVar10)) {
      pUVar11 = local_38.ptr + local_38.size;
      do {
        pUVar11->_M_endNonZeros = pUVar8->_M_endNonZeros;
        iVar6 = pUVar8->_M_index;
        uVar7 = *(undefined4 *)&pUVar8->field_0x4;
        piVar4 = pUVar8->_M_begin;
        piVar5 = pUVar8->_M_beginNonZeros;
        pUVar11->_M_end = pUVar8->_M_end;
        pUVar11->_M_beginNonZeros = piVar5;
        pUVar11->_M_index = iVar6;
        *(undefined4 *)&pUVar11->field_0x4 = uVar7;
        pUVar11->_M_begin = piVar4;
        pUVar8 = pUVar8 + 1;
        local_38.size = local_38.size + 1;
        pUVar11 = pUVar11 + 1;
      } while (pUVar8 < pUVar2);
    }
  }
  pQVar1 = &this->d->super_QArrayData;
  pUVar2 = this->ptr;
  *(undefined4 *)&this->d = local_38.d._0_4_;
  *(undefined4 *)((long)&this->d + 4) = local_38.d._4_4_;
  *(undefined4 *)&this->ptr = local_38.ptr._0_4_;
  *(undefined4 *)((long)&this->ptr + 4) = local_38.ptr._4_4_;
  qVar9 = this->size;
  this->size = local_38.size;
  local_38.d = (Data *)pQVar1;
  local_38.ptr = pUVar2;
  local_38.size = qVar9;
  if (old != (QArrayDataPointer<UncompressedRow> *)0x0) {
    local_38.d = old->d;
    local_38.ptr = old->ptr;
    old->d = (Data *)pQVar1;
    old->ptr = pUVar2;
    local_38.size = old->size;
    old->size = qVar9;
  }
  if (&(local_38.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d)->super_QArrayData,0x28,0x10);
    }
  }
LAB_00104a79:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }